

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_36::WebSocketImpl::writeQueuedControlMessage(WebSocketImpl *this)

{
  Coroutine<void> *this_00;
  int *piVar1;
  Promise<void> *promise;
  PromiseAwaiter<void> *__return_storage_ptr__;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  long *plVar5;
  undefined8 *puVar6;
  PromiseArenaMember *node;
  SourceLocation location;
  bool bVar7;
  coroutine_handle<void> coroutine;
  long lVar8;
  int iVar9;
  long in_RSI;
  Mask in_R9D;
  ArrayPtr<const_unsigned_char> AVar10;
  char *local_50;
  char *pcStack_48;
  undefined8 local_40;
  ExceptionOrValue *local_38;
  
  coroutine._M_fr_ptr = operator_new(0x460);
  *(code **)coroutine._M_fr_ptr = writeQueuedControlMessage;
  *(code **)((long)coroutine._M_fr_ptr + 8) = writeQueuedControlMessage;
  this_00 = (Coroutine<void> *)((long)coroutine._M_fr_ptr + 0x10);
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_48 = "writeQueuedControlMessage";
  local_40 = 0x1500000e54;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006bc5d0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006bc618;
  local_38 = (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98);
  location.function = "writeQueuedControlMessage";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0xe54;
  location.columnNumber = 0x15;
  kj::_::CoroutineBase::CoroutineBase((CoroutineBase *)this_00,coroutine,local_38,location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006bc5d0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006bc618;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_WebSocket)._vptr_WebSocket = (_func_int **)this_00;
  if (*(char *)(in_RSI + 0x310) == '\x01') {
    bVar7 = *(bool *)(in_RSI + 0x318);
    lVar2 = *(long *)(in_RSI + 800);
    *(long *)((long)coroutine._M_fr_ptr + 0x430) = lVar2;
    *(long *)((long)coroutine._M_fr_ptr + 0x410) = lVar2;
    lVar3 = *(long *)(in_RSI + 0x328);
    *(long *)((long)coroutine._M_fr_ptr + 0x438) = lVar3;
    *(long *)((long)coroutine._M_fr_ptr + 0x418) = lVar3;
    uVar4 = *(undefined8 *)(in_RSI + 0x330);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x440) = uVar4;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x420) = uVar4;
    *(undefined8 *)(in_RSI + 800) = 0;
    *(undefined8 *)(in_RSI + 0x328) = 0;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x448) = *(undefined8 *)(in_RSI + 0x338);
    plVar5 = *(long **)(in_RSI + 0x340);
    *(long **)((long)coroutine._M_fr_ptr + 0x450) = plVar5;
    *(undefined8 *)(in_RSI + 0x340) = 0;
    *(undefined1 *)(in_RSI + 0x310) = 0;
    if ((*(char *)(in_RSI + 0x160) == '\0') && (*(char *)(in_RSI + 0x161) != '\x01')) {
      piVar1 = (int *)((long)coroutine._M_fr_ptr + 0x458);
      puVar6 = *(undefined8 **)(in_RSI + 0x20);
      if (puVar6 == (undefined8 *)0x0) {
        *piVar1 = 0;
      }
      else {
        (**(code **)*puVar6)(puVar6,piVar1,4);
        if ((*piVar1 != 0) && (lVar3 != 0)) {
          lVar8 = 0;
          do {
            *(byte *)(lVar2 + lVar8) =
                 *(byte *)(lVar2 + lVar8) ^ *(byte *)((long)piVar1 + (ulong)((uint)lVar8 & 3));
            lVar8 = lVar8 + 1;
          } while (lVar3 != lVar8);
        }
      }
      promise = (Promise<void> *)((long)coroutine._M_fr_ptr + 0x428);
      AVar10 = Header::compose((Header *)(in_RSI + 0x163),false,bVar7,(byte)lVar3,
                               (ulong)*(uint *)((long)coroutine._M_fr_ptr + 0x458),in_R9D);
      *(ArrayPtr<const_unsigned_char> *)((long)coroutine._M_fr_ptr + 0x3f0) = AVar10;
      *(long *)((long)coroutine._M_fr_ptr + 0x400) = lVar2;
      *(long *)((long)coroutine._M_fr_ptr + 0x408) = lVar3;
      (**(code **)(*(long *)(*(long *)(in_RSI + 0x18) + 8) + 8))
                (promise,*(long *)(in_RSI + 0x18) + 8,(long)coroutine._M_fr_ptr + 0x3f0,2);
      __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
      co_await<void>(__return_storage_ptr__,promise);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x45c) = 0;
      bVar7 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar7) {
        return (PromiseBase)(PromiseBase)this;
      }
      kj::_::PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
      if (*(char *)((long)coroutine._M_fr_ptr + 0x250) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 600));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
      node = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
      if (node != (PromiseArenaMember *)0x0) {
        (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(node);
      }
      plVar5 = *(long **)((long)coroutine._M_fr_ptr + 0x450);
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x10))(plVar5,&local_50);
        iVar9 = 0;
        goto LAB_003fbf6c;
      }
      iVar9 = 0;
    }
    else {
      if (plVar5 != (long *)0x0) {
        (**(code **)(*plVar5 + 0x10))(plVar5,&local_50);
      }
      iVar9 = 3;
      kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x45e));
LAB_003fbf6c:
      plVar5 = *(long **)((long)coroutine._M_fr_ptr + 0x450);
      if (plVar5 != (long *)0x0) {
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x448))
                  (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x448),
                   (long)plVar5 + *(long *)(*plVar5 + -0x10));
      }
    }
    if (*(long *)((long)coroutine._M_fr_ptr + 0x430) != 0) {
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x410) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0x418) = 0;
      (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0x440))
                (*(undefined8 **)((long)coroutine._M_fr_ptr + 0x440),
                 *(long *)((long)coroutine._M_fr_ptr + 0x430),1,
                 *(undefined8 *)((long)coroutine._M_fr_ptr + 0x438),
                 *(undefined8 *)((long)coroutine._M_fr_ptr + 0x438),0);
    }
    if (iVar9 != 0) {
      if (iVar9 != 3) {
        if ((local_38->exception).ptr.isSet == true) {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
        }
        kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
        operator_delete(coroutine._M_fr_ptr,0x460);
        return (PromiseBase)(PromiseBase)this;
      }
      goto LAB_003fc00b;
    }
  }
  kj::_::Coroutine<void>::fulfill(this_00,(FixVoid<void> *)((long)coroutine._M_fr_ptr + 0x45d));
LAB_003fc00b:
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x45c) = 1;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> writeQueuedControlMessage() {
    KJ_IF_SOME(q, queuedControlMessage) {
      byte opcode = q.opcode;
      kj::Array<byte> payload = kj::mv(q.payload);
      auto maybeFulfiller = kj::mv(q.fulfiller);
      queuedControlMessage = kj::none;

      if (hasSentClose || disconnected) {
        KJ_IF_SOME(fulfiller, maybeFulfiller) {
          fulfiller->fulfill();
        }
        co_return;
      }

      Mask mask(maskKeyGenerator);
      if (!mask.isZero()) {
        mask.apply(payload);
      }

      kj::ArrayPtr<const byte> sendParts[2];
      sendParts[0] = sendHeader.compose(true, false, opcode, payload.size(), mask);
      sendParts[1] = payload;
      co_await stream->write(sendParts);
      KJ_IF_SOME(fulfiller, maybeFulfiller) {
        fulfiller->fulfill();
      }
    }
  }